

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_bang.c
# Opt level: O3

void bng_draw_config(t_bng *x,_glist *glist)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  _glist *p_Var4;
  ulong uVar5;
  t_atom fontatoms [3];
  char tag [128];
  
  p_Var4 = (x->x_gui).x_glist;
  uVar1 = p_Var4->gl_zoom;
  p_Var4 = glist_getcanvas(p_Var4);
  uVar2 = text_xpix((t_text *)x,glist);
  uVar3 = text_ypix((t_text *)x,glist);
  fontatoms[0].a_type = A_SYMBOL;
  fontatoms[0].a_w.w_symbol = gensym((x->x_gui).x_font);
  fontatoms[1].a_type = A_FLOAT;
  fontatoms[1].a_w._0_4_ = (undefined4)(int)-((x->x_gui).x_fontsize * uVar1);
  fontatoms[2].a_type = A_SYMBOL;
  fontatoms[2].a_w.w_symbol = gensym(sys_fontweight);
  sprintf(tag,"%lxBASE",x);
  pdgui_vmess((char *)0x0,"crs iiii",p_Var4,"coords",tag,(ulong)uVar2,(ulong)uVar3,
              (ulong)((x->x_gui).x_w + uVar2),(ulong)((x->x_gui).x_h + uVar3));
  pdgui_vmess((char *)0x0,"crs ri rk",p_Var4,"itemconfigure",tag,"-width",(ulong)uVar1,"-fill",
              (ulong)(uint)(x->x_gui).x_bcol);
  sprintf(tag,"%lxBUT",x);
  pdgui_vmess((char *)0x0,"crs iiii",p_Var4,"coords",tag,(ulong)(uVar2 + uVar1),
              (ulong)(uVar3 + uVar1),(ulong)((uVar2 - uVar1) + (x->x_gui).x_w),
              (ulong)((uVar3 - uVar1) + (x->x_gui).x_h));
  pdgui_vmess((char *)0x0,"crs ri rk",p_Var4,"itemconfigure",tag,"-width",(ulong)uVar1,"-fill",
              (ulong)(uint)(&(x->x_gui).x_fcol)[x->x_flashed == 0]);
  sprintf(tag,"%lxLABEL",x);
  pdgui_vmess((char *)0x0,"crs ii",p_Var4,"coords",tag,(ulong)((x->x_gui).x_ldx * uVar1 + uVar2),
              (ulong)(uVar1 * (x->x_gui).x_ldy + uVar3));
  uVar5 = 0xff;
  if (((x->x_gui).x_fsf.field_0x3 & 1) == 0) {
    uVar5 = (ulong)(uint)(x->x_gui).x_lcol;
  }
  pdgui_vmess((char *)0x0,"crs rA rk",p_Var4,"itemconfigure",tag,"-font",3,fontatoms,"-fill",uVar5);
  iemgui_dolabel(x,&x->x_gui,(x->x_gui).x_lab,1);
  return;
}

Assistant:

static void bng_draw_config(t_bng* x, t_glist* glist)
{
    const int zoom = IEMGUI_ZOOM(x);
    t_iemgui *iemgui = &x->x_gui;
    t_canvas *canvas = glist_getcanvas(glist);
    int xpos = text_xpix(&x->x_gui.x_obj, glist);
    int ypos = text_ypix(&x->x_gui.x_obj, glist);
    int iow = IOWIDTH * zoom, ioh = IEM_GUI_IOHEIGHT * zoom;
    int inset = zoom;
    char tag[128];
    t_atom fontatoms[3];
    SETSYMBOL(fontatoms+0, gensym(iemgui->x_font));
    SETFLOAT (fontatoms+1, -iemgui->x_fontsize*zoom);
    SETSYMBOL(fontatoms+2, gensym(sys_fontweight));

    sprintf(tag, "%lxBASE", x);
    pdgui_vmess(0, "crs iiii", canvas, "coords", tag,
        xpos, ypos, xpos + x->x_gui.x_w, ypos + x->x_gui.x_h);
    pdgui_vmess(0, "crs ri rk", canvas, "itemconfigure", tag,
        "-width", zoom, "-fill", x->x_gui.x_bcol);

    sprintf(tag, "%lxBUT", x);
    pdgui_vmess(0, "crs iiii", canvas, "coords", tag,
        xpos + inset, ypos + inset,
        xpos + x->x_gui.x_w - inset, ypos + x->x_gui.x_h - inset);
    pdgui_vmess(0, "crs ri rk", canvas, "itemconfigure", tag,
        "-width", zoom, "-fill", (x->x_flashed ? x->x_gui.x_fcol : x->x_gui.x_bcol));

    sprintf(tag, "%lxLABEL", x);
    pdgui_vmess(0, "crs ii", canvas, "coords", tag,
        xpos + x->x_gui.x_ldx * zoom, ypos + x->x_gui.x_ldy * zoom);
    pdgui_vmess(0, "crs rA rk", canvas, "itemconfigure", tag,
        "-font", 3, fontatoms,
        "-fill", (x->x_gui.x_fsf.x_selected ? IEM_GUI_COLOR_SELECTED : x->x_gui.x_lcol));
    iemgui_dolabel(x, &x->x_gui, x->x_gui.x_lab, 1);
}